

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int is_transfer)

{
  curl_trc_feat *pcVar1;
  byte bVar2;
  Curl_cwriter_phase phase;
  int iVar3;
  CURLcode CVar4;
  ulong uVar5;
  size_t sVar6;
  Curl_cwriter *pCVar7;
  ulong uVar8;
  char *pcVar9;
  Curl_cwtype **ppCVar10;
  byte *pbVar11;
  ulong max;
  Curl_cwtype *ce;
  Curl_cwtype *cwt;
  bool bVar12;
  Curl_cwriter *writer;
  ulong local_38;
  
  bVar12 = is_transfer == 0;
  local_38 = (ulong)bVar12;
  pcVar9 = "content";
  if (!bVar12) {
    pcVar9 = "transfer";
  }
  phase = bVar12 + 1 + (uint)bVar12;
LAB_0011bb29:
  while ((uVar5 = (ulong)(byte)*enclist, uVar5 < 0x2d &&
         ((0x100100000200U >> (uVar5 & 0x3f) & 1) != 0))) {
    enclist = (char *)((byte *)enclist + 1);
  }
  uVar8 = 1;
  max = 0;
  pbVar11 = (byte *)enclist;
  do {
    bVar2 = (byte)uVar5;
    if ((bVar2 != 9) && (iVar3 = (int)uVar5, iVar3 != 0x20)) {
      if ((iVar3 == 0) || (iVar3 == 0x2c)) break;
      if (3 < (byte)(bVar2 - 10)) {
        max = uVar8;
      }
    }
    uVar5 = (ulong)pbVar11[1];
    pbVar11 = pbVar11 + 1;
    uVar8 = uVar8 + 1;
  } while( true );
  if (max == 0) goto LAB_0011bdcc;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_trc_feat_write.log_level)) {
    Curl_trc_write(data,"looking for %s decoder: %.*s",pcVar9,max & 0xffffffff,enclist);
  }
  if (max == 7 && is_transfer != 0) {
    iVar3 = curl_strnequal(enclist,"chunked",7);
    bVar12 = iVar3 != 0;
    uVar5 = *(ulong *)&(data->set).field_0x8ca;
LAB_0011bc08:
    if ((((uint)uVar5 >> 0x16 & 1) == 0) && (!bVar12)) {
LAB_0011bddf:
      if (((uint)uVar5 >> 0x1c & 1) == 0) {
        return CURLE_OK;
      }
      pcVar1 = (data->state).feat;
      if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
        return CURLE_OK;
      }
      if (0 < Curl_trc_feat_write.log_level) {
        Curl_trc_write(data,"decoder not requested, ignored: %.*s",max & 0xffffffff,enclist);
        return CURLE_OK;
      }
      return CURLE_OK;
    }
  }
  else {
    uVar5 = *(ulong *)&(data->set).field_0x8ca;
    if (is_transfer != 0) {
      bVar12 = false;
      goto LAB_0011bc08;
    }
    if ((uVar5 >> 0x23 & 1) != 0) goto LAB_0011bddf;
    bVar12 = false;
  }
  sVar6 = Curl_cwriter_count(data,phase);
  if (sVar6 - 4 < 0xfffffffffffffffb) {
    Curl_failf(data,"Reject response due to more than %u content encodings",5);
    return CURLE_BAD_CONTENT_ENCODING;
  }
  if (is_transfer != 0) {
    for (ppCVar10 = transfer_unencoders; cwt = *ppCVar10, cwt != (Curl_cwtype *)0x0;
        ppCVar10 = ppCVar10 + 1) {
      iVar3 = curl_strnequal(enclist,cwt->name,max);
      if (((iVar3 != 0) && (cwt->name[max] == '\0')) ||
         ((cwt->alias != (char *)0x0 &&
          ((iVar3 = curl_strnequal(enclist,cwt->alias,max), iVar3 != 0 && (cwt->alias[max] == '\0'))
          )))) goto LAB_0011bced;
    }
  }
  for (ppCVar10 = general_unencoders; cwt = *ppCVar10, cwt != (Curl_cwtype *)0x0;
      ppCVar10 = ppCVar10 + 1) {
    iVar3 = curl_strnequal(enclist,cwt->name,max);
    if (((iVar3 != 0) && (cwt->name[max] == '\0')) ||
       ((cwt->alias != (char *)0x0 &&
        ((iVar3 = curl_strnequal(enclist,cwt->alias,max), iVar3 != 0 && (cwt->alias[max] == '\0'))))
       )) goto LAB_0011bced;
  }
  cwt = &error_writer;
LAB_0011bd13:
  if ((!bVar12 && (local_38 & 1) == 0) &&
     (pCVar7 = Curl_cwriter_get_by_name(data,"chunked"), pCVar7 != (Curl_cwriter *)0x0)) {
    Curl_failf(data,"Reject response due to \'chunked\' not being the last Transfer-Encoding");
    return CURLE_BAD_CONTENT_ENCODING;
  }
  goto LAB_0011bd3b;
LAB_0011bced:
  if (!bVar12) goto LAB_0011bd13;
  pCVar7 = Curl_cwriter_get_by_type(data,cwt);
  if (pCVar7 != (Curl_cwriter *)0x0) {
    if (data == (Curl_easy *)0x0) {
      return CURLE_OK;
    }
    if (((data->set).field_0x8cd & 0x10) != 0) {
      pcVar1 = (data->state).feat;
      if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
        return CURLE_OK;
      }
      if (0 < Curl_trc_feat_write.log_level) {
        Curl_trc_write(data,"ignoring duplicate \'chunked\' decoder");
        return CURLE_OK;
      }
      return CURLE_OK;
    }
    return CURLE_OK;
  }
LAB_0011bd3b:
  CVar4 = Curl_cwriter_create(&writer,data,cwt,phase);
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_trc_feat_write.log_level)) {
    Curl_trc_write(data,"added %s decoder %s -> %d",pcVar9,cwt->name,(ulong)CVar4);
  }
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  CVar4 = Curl_cwriter_add(data,writer);
  if (CVar4 != CURLE_OK) {
    Curl_cwriter_free(data,writer);
    return CVar4;
  }
  bVar2 = *pbVar11;
LAB_0011bdcc:
  enclist = (char *)pbVar11;
  if (bVar2 == 0) {
    return CURLE_OK;
  }
  goto LAB_0011bb29;
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int is_transfer)
{
  Curl_cwriter_phase phase = is_transfer?
                             CURL_CW_TRANSFER_DECODE:CURL_CW_CONTENT_DECODE;
  CURLcode result;

  do {
    const char *name;
    size_t namelen;
    bool is_chunked = FALSE;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    if(namelen) {
      const struct Curl_cwtype *cwt;
      struct Curl_cwriter *writer;

      CURL_TRC_WRITE(data, "looking for %s decoder: %.*s",
                     is_transfer? "transfer" : "content", (int)namelen, name);
      is_chunked = (is_transfer && (namelen == 7) &&
                    strncasecompare(name, "chunked", 7));
      /* if we skip the decoding in this phase, do not look further.
       * Exception is "chunked" transfer-encoding which always must happen */
      if((is_transfer && !data->set.http_transfer_encoding && !is_chunked) ||
         (!is_transfer && data->set.http_ce_skip)) {
        /* not requested, ignore */
        CURL_TRC_WRITE(data, "decoder not requested, ignored: %.*s",
                       (int)namelen, name);
        return CURLE_OK;
      }

      if(Curl_cwriter_count(data, phase) + 1 >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to more than %u content encodings",
              MAX_ENCODE_STACK);
        return CURLE_BAD_CONTENT_ENCODING;
      }

      cwt = find_unencode_writer(name, namelen, phase);
      if(cwt && is_chunked && Curl_cwriter_get_by_type(data, cwt)) {
        /* A 'chunked' transfer encoding has already been added.
         * Ignore duplicates. See #13451.
         * Also RFC 9112, ch. 6.1:
         * "A sender MUST NOT apply the chunked transfer coding more than
         *  once to a message body."
         */
        CURL_TRC_WRITE(data, "ignoring duplicate 'chunked' decoder");
        return CURLE_OK;
      }

      if(is_transfer && !is_chunked &&
         Curl_cwriter_get_by_name(data, "chunked")) {
        /* RFC 9112, ch. 6.1:
         * "If any transfer coding other than chunked is applied to a
         *  response's content, the sender MUST either apply chunked as the
         *  final transfer coding or terminate the message by closing the
         *  connection."
         * "chunked" must be the last added to be the first in its phase,
         *  reject this.
         */
        failf(data, "Reject response due to 'chunked' not being the last "
              "Transfer-Encoding");
        return CURLE_BAD_CONTENT_ENCODING;
      }

      if(!cwt)
        cwt = &error_writer;  /* Defer error at use. */

      result = Curl_cwriter_create(&writer, data, cwt, phase);
      CURL_TRC_WRITE(data, "added %s decoder %s -> %d",
                     is_transfer? "transfer" : "content", cwt->name, result);
      if(result)
        return result;

      result = Curl_cwriter_add(data, writer);
      if(result) {
        Curl_cwriter_free(data, writer);
        return result;
      }
    }
  } while(*enclist);

  return CURLE_OK;
}